

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O1

ImageChannelValues * __thiscall
pbrt::Image::GetChannels
          (ImageChannelValues *__return_storage_ptr__,Image *this,Point2i p,WrapMode2D wrapMode)

{
  PixelFormat PVar1;
  float *pfVar2;
  anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
  *paVar3;
  Half *pHVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  ulong uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  byte bVar24;
  bool bVar25;
  uint uVar26;
  size_t sVar27;
  anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
  *paVar28;
  ulong uVar29;
  long lVar30;
  ushort uVar31;
  ulong uVar32;
  ulong uVar33;
  undefined1 auVar35 [32];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  span<const_unsigned_char> vin;
  span<const_unsigned_char> vin_00;
  span<float> vout;
  span<float> vout_00;
  Tuple2<pbrt::Point2,_int> local_48;
  float local_3c;
  polymorphic_allocator<float> local_38;
  undefined1 auVar34 [32];
  
  sVar27 = (this->channelNames).nStored;
  local_3c = 0.0;
  local_48 = p.super_Tuple2<pbrt::Point2,_int>;
  local_38.memoryResource = pstd::pmr::new_delete_resource();
  InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::InlinedVector
            (&__return_storage_ptr__->
              super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>,
             (long)(int)sVar27,&local_3c,&local_38);
  bVar25 = RemapPixelCoords((Point2i *)&local_48,
                            (Point2i)(this->resolution).super_Tuple2<pbrt::Point2,_int>,wrapMode);
  if (bVar25) {
    uVar29 = (this->channelNames).nStored;
    uVar26 = (uint)uVar29;
    lVar30 = (long)(int)((local_48.y * (this->resolution).super_Tuple2<pbrt::Point2,_int>.x +
                         local_48.x) * uVar26);
    PVar1 = this->format;
    if (PVar1 == U256) {
      vin.ptr = (this->p8).ptr + lVar30;
      vin.n = (size_t)(int)uVar26;
      paVar3 = (anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
                *)(__return_storage_ptr__->
                  super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>).ptr;
      paVar28 = &(__return_storage_ptr__->
                 super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>).field_2;
      if (paVar3 != (anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
                     *)0x0) {
        paVar28 = paVar3;
      }
      uVar21 = (this->encoding).
               super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
               .bits;
      if (uVar21 >> 0x31 == 0) {
        if ((uVar29 & 0xffffffff) != 0) {
          sVar27 = 0;
          do {
            paVar28->fixed[sVar27] = (float)vin.ptr[sVar27] / 255.0;
            sVar27 = sVar27 + 1;
          } while (vin.n != sVar27);
        }
      }
      else if ((uVar21 & 0xffff000000000000) == 0x2000000000000) {
        vout.n = vin.n;
        vout.ptr = (float *)paVar28;
        sRGBColorEncoding::ToLinear((sRGBColorEncoding *)(uVar21 & 0xffffffffffff),vin,vout);
      }
      else {
        vin_00.n = vin.n;
        vin_00.ptr = vin.ptr;
        vout_00.n = vin.n;
        vout_00.ptr = (float *)paVar28;
        GammaColorEncoding::ToLinear((GammaColorEncoding *)(uVar21 & 0xffffffffffff),vin_00,vout_00)
        ;
      }
    }
    else if (PVar1 == Half) {
      if (0 < (int)uVar26) {
        pHVar4 = (this->p16).ptr;
        paVar3 = (anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
                  *)(__return_storage_ptr__->
                    super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>).ptr;
        paVar28 = &(__return_storage_ptr__->
                   super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>).field_2;
        if (paVar3 != (anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
                       *)0x0) {
          paVar28 = paVar3;
        }
        auVar36 = vpbroadcastq_avx512f();
        uVar29 = 0;
        auVar37 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
        auVar38 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
        auVar39 = vpbroadcastd_avx512f(ZEXT416(0xf800000));
        auVar40 = vpbroadcastd_avx512f(ZEXT416(0xfffe000));
        auVar41 = vpbroadcastd_avx512f(ZEXT416(0x38800000));
        auVar42 = vbroadcastss_avx512f(ZEXT416(0xb8800000));
        auVar43 = vpbroadcastd_avx512f(ZEXT416(0x70000000));
        auVar44 = vpbroadcastd_avx512f(ZEXT416(0x38000000));
        auVar45 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
        do {
          auVar46 = vpbroadcastq_avx512f();
          auVar47 = vporq_avx512f(auVar46,auVar37);
          auVar46 = vporq_avx512f(auVar46,auVar38);
          uVar22 = vpcmpuq_avx512f(auVar46,auVar36,2);
          uVar23 = vpcmpuq_avx512f(auVar47,auVar36,2);
          bVar24 = (byte)uVar23;
          uVar31 = CONCAT11(bVar24,(byte)uVar22);
          auVar34 = vmovdqu16_avx512vl(*(undefined1 (*) [32])(pHVar4 + lVar30 + uVar29));
          auVar35._2_2_ = (ushort)((byte)(uVar31 >> 1) & 1) * auVar34._2_2_;
          auVar35._0_2_ = (ushort)((byte)uVar22 & 1) * auVar34._0_2_;
          auVar35._4_2_ = (ushort)((byte)(uVar31 >> 2) & 1) * auVar34._4_2_;
          auVar35._6_2_ = (ushort)((byte)(uVar31 >> 3) & 1) * auVar34._6_2_;
          auVar35._8_2_ = (ushort)((byte)(uVar31 >> 4) & 1) * auVar34._8_2_;
          auVar35._10_2_ = (ushort)((byte)(uVar31 >> 5) & 1) * auVar34._10_2_;
          auVar35._12_2_ = (ushort)((byte)(uVar31 >> 6) & 1) * auVar34._12_2_;
          auVar35._14_2_ = (ushort)((byte)(uVar31 >> 7) & 1) * auVar34._14_2_;
          auVar35._16_2_ = (ushort)(bVar24 & 1) * auVar34._16_2_;
          auVar35._18_2_ = (ushort)(bVar24 >> 1 & 1) * auVar34._18_2_;
          auVar35._20_2_ = (ushort)(bVar24 >> 2 & 1) * auVar34._20_2_;
          auVar35._22_2_ = (ushort)(bVar24 >> 3 & 1) * auVar34._22_2_;
          auVar35._24_2_ = (ushort)(bVar24 >> 4 & 1) * auVar34._24_2_;
          auVar35._26_2_ = (ushort)(bVar24 >> 5 & 1) * auVar34._26_2_;
          auVar35._28_2_ = (ushort)(bVar24 >> 6 & 1) * auVar34._28_2_;
          auVar35._30_2_ = (ushort)(bVar24 >> 7) * auVar34._30_2_;
          auVar46 = vpmovzxwd_avx512f(auVar35);
          auVar46 = vpslld_avx512f(auVar46,0xd);
          auVar47 = vpandd_avx512f(auVar46,auVar39);
          uVar21 = vpcmpd_avx512f(auVar47,auVar39,4);
          auVar48 = vpandd_avx512f(auVar46,auVar40);
          uVar33 = vptestnmd_avx512f(auVar47,auVar47);
          uVar33 = uVar31 & uVar21 & uVar33;
          auVar49 = vpord_avx512f(auVar46,auVar41);
          auVar49 = vaddps_avx512f(auVar49,auVar42);
          vpcmpeqd_avx512f(auVar47,auVar39);
          auVar46 = vpord_avx512f(auVar46,auVar43);
          uVar32 = vptestmd_avx512f(auVar47,auVar47);
          uVar32 = uVar31 & uVar21 & uVar32;
          auVar47 = vmovdqa32_avx512f(auVar49);
          bVar25 = (bool)((byte)uVar33 & 1);
          bVar6 = (bool)((byte)(uVar33 >> 1) & 1);
          bVar7 = (bool)((byte)(uVar33 >> 2) & 1);
          bVar8 = (bool)((byte)(uVar33 >> 3) & 1);
          bVar9 = (bool)((byte)(uVar33 >> 4) & 1);
          bVar10 = (bool)((byte)(uVar33 >> 5) & 1);
          bVar11 = (bool)((byte)(uVar33 >> 6) & 1);
          bVar12 = (bool)((byte)(uVar33 >> 7) & 1);
          bVar13 = (bool)((byte)(uVar33 >> 8) & 1);
          bVar14 = (bool)((byte)(uVar33 >> 9) & 1);
          bVar15 = (bool)((byte)(uVar33 >> 10) & 1);
          bVar16 = (bool)((byte)(uVar33 >> 0xb) & 1);
          bVar17 = (bool)((byte)(uVar33 >> 0xc) & 1);
          bVar18 = (bool)((byte)(uVar33 >> 0xd) & 1);
          bVar19 = (bool)((byte)(uVar33 >> 0xe) & 1);
          bVar20 = SUB81(uVar33 >> 0xf,0);
          auVar48 = vpaddd_avx512f(auVar48,auVar44);
          bVar5 = (bool)((byte)uVar32 & 1);
          auVar49._0_4_ =
               (uint)bVar5 * auVar48._0_4_ |
               (uint)!bVar5 * ((uint)bVar25 * auVar47._0_4_ | (uint)!bVar25 * auVar46._0_4_);
          bVar25 = (bool)((byte)(uVar32 >> 1) & 1);
          auVar49._4_4_ =
               (uint)bVar25 * auVar48._4_4_ |
               (uint)!bVar25 * ((uint)bVar6 * auVar47._4_4_ | (uint)!bVar6 * auVar46._4_4_);
          bVar25 = (bool)((byte)(uVar32 >> 2) & 1);
          auVar49._8_4_ =
               (uint)bVar25 * auVar48._8_4_ |
               (uint)!bVar25 * ((uint)bVar7 * auVar47._8_4_ | (uint)!bVar7 * auVar46._8_4_);
          bVar25 = (bool)((byte)(uVar32 >> 3) & 1);
          auVar49._12_4_ =
               (uint)bVar25 * auVar48._12_4_ |
               (uint)!bVar25 * ((uint)bVar8 * auVar47._12_4_ | (uint)!bVar8 * auVar46._12_4_);
          bVar25 = (bool)((byte)(uVar32 >> 4) & 1);
          auVar49._16_4_ =
               (uint)bVar25 * auVar48._16_4_ |
               (uint)!bVar25 * ((uint)bVar9 * auVar47._16_4_ | (uint)!bVar9 * auVar46._16_4_);
          bVar25 = (bool)((byte)(uVar32 >> 5) & 1);
          auVar49._20_4_ =
               (uint)bVar25 * auVar48._20_4_ |
               (uint)!bVar25 * ((uint)bVar10 * auVar47._20_4_ | (uint)!bVar10 * auVar46._20_4_);
          bVar25 = (bool)((byte)(uVar32 >> 6) & 1);
          auVar49._24_4_ =
               (uint)bVar25 * auVar48._24_4_ |
               (uint)!bVar25 * ((uint)bVar11 * auVar47._24_4_ | (uint)!bVar11 * auVar46._24_4_);
          bVar25 = (bool)((byte)(uVar32 >> 7) & 1);
          auVar49._28_4_ =
               (uint)bVar25 * auVar48._28_4_ |
               (uint)!bVar25 * ((uint)bVar12 * auVar47._28_4_ | (uint)!bVar12 * auVar46._28_4_);
          bVar25 = (bool)((byte)(uVar32 >> 8) & 1);
          auVar49._32_4_ =
               (uint)bVar25 * auVar48._32_4_ |
               (uint)!bVar25 * ((uint)bVar13 * auVar47._32_4_ | (uint)!bVar13 * auVar46._32_4_);
          bVar25 = (bool)((byte)(uVar32 >> 9) & 1);
          auVar49._36_4_ =
               (uint)bVar25 * auVar48._36_4_ |
               (uint)!bVar25 * ((uint)bVar14 * auVar47._36_4_ | (uint)!bVar14 * auVar46._36_4_);
          bVar25 = (bool)((byte)(uVar32 >> 10) & 1);
          auVar49._40_4_ =
               (uint)bVar25 * auVar48._40_4_ |
               (uint)!bVar25 * ((uint)bVar15 * auVar47._40_4_ | (uint)!bVar15 * auVar46._40_4_);
          bVar25 = (bool)((byte)(uVar32 >> 0xb) & 1);
          auVar49._44_4_ =
               (uint)bVar25 * auVar48._44_4_ |
               (uint)!bVar25 * ((uint)bVar16 * auVar47._44_4_ | (uint)!bVar16 * auVar46._44_4_);
          bVar25 = (bool)((byte)(uVar32 >> 0xc) & 1);
          auVar49._48_4_ =
               (uint)bVar25 * auVar48._48_4_ |
               (uint)!bVar25 * ((uint)bVar17 * auVar47._48_4_ | (uint)!bVar17 * auVar46._48_4_);
          bVar25 = (bool)((byte)(uVar32 >> 0xd) & 1);
          auVar49._52_4_ =
               (uint)bVar25 * auVar48._52_4_ |
               (uint)!bVar25 * ((uint)bVar18 * auVar47._52_4_ | (uint)!bVar18 * auVar46._52_4_);
          bVar25 = (bool)((byte)(uVar32 >> 0xe) & 1);
          auVar49._56_4_ =
               (uint)bVar25 * auVar48._56_4_ |
               (uint)!bVar25 * ((uint)bVar19 * auVar47._56_4_ | (uint)!bVar19 * auVar46._56_4_);
          bVar25 = SUB81(uVar32 >> 0xf,0);
          auVar49._60_4_ =
               (uint)bVar25 * auVar48._60_4_ |
               (uint)!bVar25 * ((uint)bVar20 * auVar47._60_4_ | (uint)!bVar20 * auVar46._60_4_);
          auVar46 = vpmovsxwd_avx512f(auVar35);
          auVar46 = vpternlogd_avx512f(auVar46,auVar49,auVar45,0xec);
          auVar46 = vmovdqu32_avx512f(auVar46);
          *(undefined1 (*) [64])((long)paVar28 + uVar29 * 4) = auVar46;
          uVar29 = uVar29 + 0x10;
        } while ((uVar26 + 0xf & 0xfffffff0) != uVar29);
      }
    }
    else {
      if (PVar1 != Float) {
        LogFatal(Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/image.cpp"
                 ,0x1ea,"Unhandled PixelFormat");
      }
      if (0 < (int)uVar26) {
        pfVar2 = (this->p32).ptr;
        paVar3 = (anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
                  *)(__return_storage_ptr__->
                    super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>).ptr;
        paVar28 = &(__return_storage_ptr__->
                   super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>).field_2;
        if (paVar3 != (anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
                       *)0x0) {
          paVar28 = paVar3;
        }
        uVar29 = 0;
        do {
          paVar28->fixed[uVar29] = pfVar2[lVar30 + uVar29];
          uVar29 = uVar29 + 1;
        } while ((uVar26 & 0x7fffffff) != uVar29);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

ImageChannelValues Image::GetChannels(Point2i p, WrapMode2D wrapMode) const {
    ImageChannelValues cv(NChannels(), Float(0));
    if (!RemapPixelCoords(&p, resolution, wrapMode))
        return cv;

    size_t pixelOffset = PixelOffset(p);
    switch (format) {
    case PixelFormat::U256: {
        encoding.ToLinear({&p8[pixelOffset], size_t(NChannels())},
                          {&cv[0], size_t(NChannels())});
        break;
    }
    case PixelFormat::Half: {
        for (int i = 0; i < NChannels(); ++i)
            cv[i] = Float(p16[pixelOffset + i]);
        break;
    }
    case PixelFormat::Float: {
        for (int i = 0; i < NChannels(); ++i)
            cv[i] = p32[pixelOffset + i];
        break;
    }
    default:
        LOG_FATAL("Unhandled PixelFormat");
    }

    return cv;
}